

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

void __thiscall TrodesConfig::TrodesConfig(TrodesConfig *this,TrodesConfig *obj)

{
  int iVar1;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  TrodesConfig *dst;
  vector<NDevice,_std::allocator<NDevice>_> vStack_38;
  
  (this->super_NetworkDataType)._vptr_NetworkDataType = (_func_int **)&PTR__TrodesConfig_0043ada8;
  (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dst = obj;
  clear(this);
  iVar1 = copy(obj,(EVP_PKEY_CTX *)dst,src);
  std::vector<NDevice,_std::allocator<NDevice>_>::vector
            (&vStack_38,
             (vector<NDevice,_std::allocator<NDevice>_> *)(CONCAT44(extraout_var,iVar1) + 8));
  std::vector<NDevice,_std::allocator<NDevice>_>::_M_move_assign(&this->devices,&vStack_38);
  std::vector<NDevice,_std::allocator<NDevice>_>::~vector(&vStack_38);
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::vector
            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)&vStack_38,
             (vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)(CONCAT44(extraout_var,iVar1) + 0x20))
  ;
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::_M_move_assign(&this->nTrodes,&vStack_38);
  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::~vector
            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)&vStack_38);
  return;
}

Assistant:

TrodesConfig::TrodesConfig(const TrodesConfig &obj) {
    clear();
//    std::cerr << "COPYING [" << &obj << "] into this [" << this << "]\n";

    TrodesConfig *objCpy = obj.copy(); //create a new memory copy of the target TrodesConfig object and assign it to self
    devices = objCpy->getDevices();
    nTrodes = objCpy->getNTrodes();
}